

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          BaseTextGenerator *generator)

{
  ulong uVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  CppType CVar5;
  Type TVar6;
  LogMessage *pLVar7;
  ulong uVar8;
  Type *v1;
  Type *v2;
  char *failure_msg;
  EnumDescriptor *this_00;
  string *psVar9;
  AlphaNum *a;
  Message *local_2b0;
  int local_27c;
  string *local_238;
  bool local_221;
  double local_218;
  float local_204;
  uint64_t local_1f8;
  uint32_t local_1e4;
  int64_t local_1d8;
  int32_t local_1c4;
  AlphaNum local_188;
  string local_158;
  EnumValueDescriptor *local_138;
  EnumValueDescriptor *enum_desc;
  undefined1 local_128 [4];
  int enum_value;
  Voidify local_111;
  Type local_110;
  Type local_10c;
  Nullable<const_char_*> local_108;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [8];
  string truncated_value;
  string *value_to_print;
  string *value;
  string scratch;
  FastFieldValuePrinter *printer;
  LogMessage local_50;
  Voidify local_39;
  BaseTextGenerator *local_38;
  BaseTextGenerator *generator_local;
  FieldDescriptor *pFStack_28;
  int index_local;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  Printer *this_local;
  
  local_38 = generator;
  generator_local._4_4_ = index;
  pFStack_28 = field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  bVar4 = FieldDescriptor::is_repeated(field);
  if (!bVar4 && generator_local._4_4_ != -1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0xa90,"field->is_repeated() || (index == -1)");
    pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar7,(char (*) [41])"Index must be -1 for non-repeated fields");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar7);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  scratch.field_2._8_8_ = GetFieldPrinter(this,pFStack_28);
  bVar4 = TryRedactFieldValue(this,(Message *)reflection_local,pFStack_28,local_38,false);
  if (!bVar4) {
    CVar5 = FieldDescriptor::cpp_type(pFStack_28);
    uVar3 = scratch.field_2._8_8_;
    switch(CVar5) {
    case CPPTYPE_INT32:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_1c4 = Reflection::GetRepeatedInt32
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_1c4 = Reflection::GetInt32
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
      }
      (**(code **)(*(long *)uVar3 + 0x18))(uVar3,local_1c4,local_38);
      break;
    case CPPTYPE_INT64:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_1d8 = Reflection::GetRepeatedInt64
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_1d8 = Reflection::GetInt64
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
      }
      (**(code **)(*(long *)uVar3 + 0x28))(uVar3,local_1d8,local_38);
      break;
    case CPPTYPE_UINT32:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_1e4 = Reflection::GetRepeatedUInt32
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_1e4 = Reflection::GetUInt32
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
      }
      (**(code **)(*(long *)uVar3 + 0x20))(uVar3,local_1e4,local_38);
      break;
    case CPPTYPE_UINT64:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_1f8 = Reflection::GetRepeatedUInt64
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_1f8 = Reflection::GetUInt64
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
      }
      (**(code **)(*(long *)uVar3 + 0x30))(uVar3,local_1f8,local_38);
      break;
    case CPPTYPE_DOUBLE:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_218 = Reflection::GetRepeatedDouble
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_218 = Reflection::GetDouble
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
      }
      (**(code **)(*(long *)uVar3 + 0x40))(local_218,uVar3,local_38);
      break;
    case CPPTYPE_FLOAT:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_204 = Reflection::GetRepeatedFloat
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_204 = Reflection::GetFloat
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
      }
      (**(code **)(*(long *)uVar3 + 0x38))(local_204,uVar3,local_38);
      break;
    case CPPTYPE_BOOL:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_221 = Reflection::GetRepeatedBool
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_221 = Reflection::GetBool((Reflection *)field_local,(Message *)reflection_local,
                                        pFStack_28);
      }
      (**(code **)(*(long *)uVar3 + 0x10))(uVar3,local_221,local_38);
      break;
    case CPPTYPE_ENUM:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_27c = Reflection::GetRepeatedEnumValue
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_27c = Reflection::GetEnumValue
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28);
      }
      enum_desc._4_4_ = local_27c;
      this_00 = FieldDescriptor::enum_type(pFStack_28);
      local_138 = EnumDescriptor::FindValueByNumber(this_00,enum_desc._4_4_);
      uVar3 = scratch.field_2._8_8_;
      iVar2 = enum_desc._4_4_;
      if (local_138 == (EnumValueDescriptor *)0x0) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_188,enum_desc._4_4_);
        absl::lts_20250127::StrCat_abi_cxx11_(&local_158,(lts_20250127 *)&local_188,a);
        (**(code **)(*(long *)uVar3 + 0x58))(uVar3,iVar2,&local_158,local_38);
        std::__cxx11::string::~string((string *)&local_158);
      }
      else {
        psVar9 = internal::NameOfEnumAsString_abi_cxx11_(local_138);
        (**(code **)(*(long *)uVar3 + 0x58))(uVar3,iVar2,psVar9,local_38);
      }
      break;
    case CPPTYPE_STRING:
      std::__cxx11::string::string((string *)&value);
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_238 = Reflection::GetRepeatedStringReference
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_,(string *)&value);
      }
      else {
        local_238 = Reflection::GetStringReference
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               (string *)&value);
      }
      truncated_value.field_2._8_8_ = local_238;
      std::__cxx11::string::string(local_c0);
      if ((0 < this->truncate_string_field_longer_than_) &&
         (uVar1 = this->truncate_string_field_longer_than_, uVar8 = std::__cxx11::string::size(),
         uVar1 < uVar8)) {
        std::__cxx11::string::substr((ulong)&absl_log_internal_check_op_result,(ulong)local_238);
        std::operator+(&local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &absl_log_internal_check_op_result,"...<truncated>...");
        std::__cxx11::string::operator=(local_c0,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&absl_log_internal_check_op_result);
        truncated_value.field_2._8_8_ = local_c0;
      }
      TVar6 = FieldDescriptor::type(pFStack_28);
      if (TVar6 == TYPE_STRING) {
        (**(code **)(*(long *)scratch.field_2._8_8_ + 0x48))
                  (scratch.field_2._8_8_,truncated_value.field_2._8_8_,local_38);
      }
      else {
        local_10c = FieldDescriptor::type(pFStack_28);
        v1 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>
                       (&local_10c);
        local_110 = TYPE_BYTES;
        v2 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>
                       (&local_110);
        local_108 = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                              (v1,v2,"field->type() == FieldDescriptor::TYPE_BYTES");
        if (local_108 != (Nullable<const_char_*>)0x0) {
          failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_108);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_128,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                     ,0xabf,failure_msg);
          pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                             ((LogMessage *)local_128);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_111,pLVar7);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_128);
        }
        (**(code **)(*(long *)scratch.field_2._8_8_ + 0x50))
                  (scratch.field_2._8_8_,truncated_value.field_2._8_8_,local_38);
      }
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string((string *)&value);
      break;
    case CPPTYPE_MESSAGE:
      bVar4 = FieldDescriptor::is_repeated(pFStack_28);
      if (bVar4) {
        local_2b0 = Reflection::GetRepeatedMessage
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               generator_local._4_4_);
      }
      else {
        local_2b0 = Reflection::GetMessage
                              ((Reflection *)field_local,(Message *)reflection_local,pFStack_28,
                               (MessageFactory *)0x0);
      }
      Print(this,local_2b0,local_38);
    }
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          BaseTextGenerator* generator) const {
  ABSL_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);
  if (TryRedactFieldValue(message, field, generator,
                          /*insert_value_separator=*/false)) {
    return;
  }

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          static_cast<size_t>(truncate_string_field_longer_than_) <
              value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        ABSL_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, internal::NameOfEnumAsString(enum_desc),
                           generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, absl::StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}